

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

uint32 __thiscall
Js::TypedArrayBase::ValidateAndReturnIndex
          (TypedArrayBase *this,Var index,bool *skipOperation,bool *isNumericIndex)

{
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  uint32 uVar4;
  JavascriptString *aValue;
  ScriptContext *scriptContext;
  double dVar5;
  bool local_51;
  double dStack_40;
  uint32 uint32Index;
  double dIndexValue;
  int32 indexInt;
  uint32 length;
  bool *isNumericIndex_local;
  bool *skipOperation_local;
  Var index_local;
  TypedArrayBase *this_local;
  
  *skipOperation = false;
  *isNumericIndex = true;
  _indexInt = isNumericIndex;
  isNumericIndex_local = skipOperation;
  skipOperation_local = (bool *)index;
  index_local = this;
  dIndexValue._4_4_ = ArrayObject::GetLength((ArrayObject *)this);
  bVar1 = TaggedInt::Is(skipOperation_local);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(skipOperation_local);
    local_51 = (int)uVar2 < 0 || dIndexValue._4_4_ <= uVar2;
    *isNumericIndex_local = local_51;
    return uVar2;
  }
  dStack_40 = 0.0;
  bVar1 = VarIs<Js::JavascriptString>(skipOperation_local);
  if (bVar1) {
    aValue = VarTo<Js::JavascriptString>(skipOperation_local);
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    BVar3 = JavascriptConversion::CanonicalNumericIndexString
                      (aValue,&stack0xffffffffffffffc0,scriptContext);
    if (BVar3 == 0) {
      *_indexInt = false;
      return 0;
    }
    BVar3 = JavascriptNumber::IsNegZero(dStack_40);
    if (BVar3 != 0) {
      *isNumericIndex_local = true;
      return 0;
    }
  }
  else {
    dStack_40 = JavascriptNumber::GetValue(skipOperation_local);
  }
  uVar2 = (uint)(long)dStack_40;
  dVar5 = (double)((long)dStack_40 & 0xffffffff);
  if ((dVar5 != dStack_40) || (NAN(dVar5) || NAN(dStack_40))) {
    *isNumericIndex_local = true;
  }
  else {
    uVar4 = ArrayObject::GetLength((ArrayObject *)this);
    if (uVar4 <= uVar2) {
      *isNumericIndex_local = true;
    }
  }
  return uVar2;
}

Assistant:

_Use_decl_annotations_ uint32 TypedArrayBase::ValidateAndReturnIndex(Js::Var index, bool * skipOperation, bool * isNumericIndex)
    {
        *skipOperation = false;
        *isNumericIndex = true;
        uint32 length = GetLength();

        if (TaggedInt::Is(index))
        {
            int32 indexInt = TaggedInt::ToInt32(index);
            *skipOperation = (indexInt < 0 || (uint32)indexInt >= length);
            return (uint32)indexInt;
        }
        else
        {
            double dIndexValue = 0;
            if (VarIs<JavascriptString>(index))
            {
                if (JavascriptConversion::CanonicalNumericIndexString(VarTo<JavascriptString>(index), &dIndexValue, GetScriptContext()))
                {
                    if (JavascriptNumber::IsNegZero(dIndexValue))
                    {
                        *skipOperation = true;
                        return 0;
                    }
                    // If this is numeric index embedded in string, perform regular numeric index checks below
                }
                else
                {
                    // not numeric index, go the [[Set]] path to add as string property
                    *isNumericIndex = false;
                    return 0;
                }
            }
            else
            {
                // JavascriptNumber::Is_NoTaggedIntCheck(index)
                dIndexValue = JavascriptNumber::GetValue(index);
            }

            // OK to lose data because we want to verify ToInteger()
            uint32 uint32Index = (uint32)dIndexValue;

            // IsInteger()
            if ((double)uint32Index != dIndexValue)
            {
                *skipOperation = true;
            }
            // index >= length
            else if (uint32Index >= GetLength())
            {
                *skipOperation = true;
            }
            return uint32Index;
        }
    }